

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<DataStream,transaction_identifier<false>,unsigned_int>
               (DataStream *os,pair<transaction_identifier<false>,_unsigned_int> *item)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)item,os);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<DataStream>(os,item->second);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}